

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O0

void testing::Mock::Register(void *mock_obj,UntypedFunctionMockerBase *mocker)

{
  map<const_void_*,_testing::(anonymous_namespace)::MockObjectState,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_testing::(anonymous_namespace)::MockObjectState>_>_>
  *in_RSI;
  MutexLock l;
  undefined7 in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffaf;
  GTestMutexLock *in_stack_ffffffffffffffb0;
  value_type *in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffd0;
  undefined7 in_stack_ffffffffffffffd1;
  key_type *in_stack_ffffffffffffffe8;
  
  internal::GTestMutexLock::GTestMutexLock
            (in_stack_ffffffffffffffb0,
             (MutexBase *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
  anon_unknown_18::MockObjectRegistry::states
            ((MockObjectRegistry *)(anonymous_namespace)::g_mock_object_registry);
  std::
  map<const_void_*,_testing::(anonymous_namespace)::MockObjectState,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_testing::(anonymous_namespace)::MockObjectState>_>_>
  ::operator[](in_RSI,in_stack_ffffffffffffffe8);
  std::
  set<testing::internal::UntypedFunctionMockerBase_*,_std::less<testing::internal::UntypedFunctionMockerBase_*>,_std::allocator<testing::internal::UntypedFunctionMockerBase_*>_>
  ::insert((set<testing::internal::UntypedFunctionMockerBase_*,_std::less<testing::internal::UntypedFunctionMockerBase_*>,_std::allocator<testing::internal::UntypedFunctionMockerBase_*>_>
            *)CONCAT71(in_stack_ffffffffffffffd1,in_stack_ffffffffffffffd0),
           in_stack_ffffffffffffffc8);
  internal::GTestMutexLock::~GTestMutexLock((GTestMutexLock *)0x1330f2);
  return;
}

Assistant:

GTEST_LOCK_EXCLUDED_(internal::g_gmock_mutex) {
  internal::MutexLock l(&internal::g_gmock_mutex);
  g_mock_object_registry.states()[mock_obj].function_mockers.insert(mocker);
}